

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

int __thiscall
cmMakefile::TryCompile
          (cmMakefile *this,string *srcdir,string *bindir,string *projectName,string *targetName,
          bool fast,int jobs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmakeArgs,string *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  cmGlobalGenerator *gg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string *local_3e8;
  string *local_3e0;
  string *local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  cmWorkingDirectory workdir;
  cmake cm;
  
  this_00 = &bStack_428;
  this->IsSourceFileTryCompile = fast;
  local_3e8 = srcdir;
  local_3e0 = projectName;
  local_3d8 = targetName;
  bVar1 = cmsys::SystemTools::FileIsDirectory(bindir);
  if (!bVar1) {
    cmsys::SystemTools::MakeDirectory(bindir,(mode_t *)0x0);
  }
  cmWorkingDirectory::cmWorkingDirectory(&workdir,bindir);
  if (workdir.ResultCode != 0) {
    std::operator+(&local_408,"Failed to set working directory to ",bindir);
    std::operator+(&bStack_428,&local_408," : ");
    pcVar4 = strerror(workdir.ResultCode);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cm,
                   &bStack_428,pcVar4);
    IssueMessage(this,FATAL_ERROR,(string *)&cm);
    std::__cxx11::string::~string((string *)&cm);
    std::__cxx11::string::~string((string *)&bStack_428);
    std::__cxx11::string::~string((string *)&local_408);
    cmSystemTools::s_FatalErrorOccured = true;
    this->IsSourceFileTryCompile = false;
    iVar3 = 1;
    goto LAB_0019ff77;
  }
  cmake::cmake(&cm,RoleProject,Project);
  iVar3 = 1;
  cmake::SetIsInTryCompile(&cm,true);
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&bStack_428);
  gg = cmake::CreateGlobalGenerator(&cm,&bStack_428);
  std::__cxx11::string::~string((string *)&bStack_428);
  if (gg == (cmGlobalGenerator *)0x0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_3d0);
    std::operator+(&local_408,"Global generator \'",&local_3d0);
    std::operator+(&bStack_428,&local_408,"\' could not be created.");
    IssueMessage(this,INTERNAL_ERROR,&bStack_428);
    std::__cxx11::string::~string((string *)&bStack_428);
    std::__cxx11::string::~string((string *)&local_408);
    this_00 = &local_3d0;
LAB_0019ff54:
    std::__cxx11::string::~string((string *)this_00);
    cmSystemTools::s_FatalErrorOccured = true;
  }
  else {
    gg->RecursionDepth = this->RecursionDepth;
    cmake::SetGlobalGenerator(&cm,gg);
    cmake::SetHomeDirectory(&cm,local_3e8);
    cmake::SetHomeOutputDirectory(&cm,bindir);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bStack_428,"CMAKE_GENERATOR_INSTANCE",(allocator<char> *)&local_408);
    GetSafeDefinition(this,&bStack_428);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorInstance);
    std::__cxx11::string::~string((string *)&bStack_428);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bStack_428,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)&local_408);
    GetSafeDefinition(this,&bStack_428);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorPlatform);
    std::__cxx11::string::~string((string *)&bStack_428);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bStack_428,"CMAKE_GENERATOR_TOOLSET",(allocator<char> *)&local_408);
    GetSafeDefinition(this,&bStack_428);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorToolset);
    std::__cxx11::string::~string((string *)&bStack_428);
    cmake::LoadCache(&cm);
    iVar2 = (*gg->_vptr_cmGlobalGenerator[0x23])(gg);
    if ((char)iVar2 == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bStack_428,"CMAKE_TRY_COMPILE_CONFIGURATION",
                 (allocator<char> *)&local_408);
      pcVar4 = GetDefinition(this,&bStack_428);
      std::__cxx11::string::~string((string *)&bStack_428);
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bStack_428,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_408);
        cmake::AddCacheEntry(&cm,&bStack_428,pcVar4,"Build configuration",3);
        std::__cxx11::string::~string((string *)&bStack_428);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bStack_428,"CMAKE_MAXIMUM_RECURSION_DEPTH",(allocator<char> *)&local_408);
    pcVar4 = GetDefinition(this,&bStack_428);
    std::__cxx11::string::~string((string *)&bStack_428);
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bStack_428,"CMAKE_MAXIMUM_RECURSION_DEPTH",(allocator<char> *)&local_408
                );
      cmake::AddCacheEntry(&cm,&bStack_428,pcVar4,"Maximum recursion depth",3);
      std::__cxx11::string::~string((string *)&bStack_428);
    }
    if (cmakeArgs !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      cm.WarnUnusedCli = false;
      cmake::SetCacheArgs(&cm,cmakeArgs);
    }
    cmGlobalGenerator::EnableLanguagesFromGenerator(gg,this->GlobalGenerator,this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bStack_428,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
               (allocator<char> *)&local_408);
    bVar1 = IsOn(this,&bStack_428);
    std::__cxx11::string::~string((string *)&bStack_428);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bStack_428,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
                 (allocator<char> *)&local_408);
      cmake::AddCacheEntry(&cm,&bStack_428,"TRUE","",4);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bStack_428,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
                 (allocator<char> *)&local_408);
      cmake::AddCacheEntry(&cm,&bStack_428,"FALSE","",4);
    }
    std::__cxx11::string::~string((string *)&bStack_428);
    iVar2 = cmake::Configure(&cm);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bStack_428,"Failed to configure test project build system.",
                 (allocator<char> *)&local_408);
      IssueMessage(this,FATAL_ERROR,&bStack_428);
      this_00 = &bStack_428;
      goto LAB_0019ff54;
    }
    iVar2 = cmake::Generate(&cm);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bStack_428,"Failed to generate test project build system.",
                 (allocator<char> *)&local_408);
      IssueMessage(this,FATAL_ERROR,&bStack_428);
      goto LAB_0019ff54;
    }
    iVar3 = cmGlobalGenerator::TryCompile
                      (this->GlobalGenerator,jobs,local_3e8,bindir,local_3e0,local_3d8,fast,output,
                       this);
  }
  this->IsSourceFileTryCompile = false;
  cmake::~cmake(&cm);
LAB_0019ff77:
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return iVar3;
}

Assistant:

int cmMakefile::TryCompile(const std::string& srcdir,
                           const std::string& bindir,
                           const std::string& projectName,
                           const std::string& targetName, bool fast, int jobs,
                           const std::vector<std::string>* cmakeArgs,
                           std::string& output)
{
  this->IsSourceFileTryCompile = fast;
  // does the binary directory exist ? If not create it...
  if (!cmSystemTools::FileIsDirectory(bindir)) {
    cmSystemTools::MakeDirectory(bindir);
  }

  // change to the tests directory and run cmake
  // use the cmake object instead of calling cmake
  cmWorkingDirectory workdir(bindir);
  if (workdir.Failed()) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to set working directory to " + bindir + " : " +
                         std::strerror(workdir.GetLastResult()));
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // make sure the same generator is used
  // use this program as the cmake to be run, it should not
  // be run that way but the cmake object requires a vailid path
  cmake cm(cmake::RoleProject, cmState::Project);
  cm.SetIsInTryCompile(true);
  cmGlobalGenerator* gg =
    cm.CreateGlobalGenerator(this->GetGlobalGenerator()->GetName());
  if (!gg) {
    this->IssueMessage(MessageType::INTERNAL_ERROR,
                       "Global generator '" +
                         this->GetGlobalGenerator()->GetName() +
                         "' could not be created.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }
  gg->RecursionDepth = this->RecursionDepth;
  cm.SetGlobalGenerator(gg);

  // do a configure
  cm.SetHomeDirectory(srcdir);
  cm.SetHomeOutputDirectory(bindir);
  cm.SetGeneratorInstance(this->GetSafeDefinition("CMAKE_GENERATOR_INSTANCE"));
  cm.SetGeneratorPlatform(this->GetSafeDefinition("CMAKE_GENERATOR_PLATFORM"));
  cm.SetGeneratorToolset(this->GetSafeDefinition("CMAKE_GENERATOR_TOOLSET"));
  cm.LoadCache();
  if (!gg->IsMultiConfig()) {
    if (const char* config =
          this->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION")) {
      // Tell the single-configuration generator which one to use.
      // Add this before the user-provided CMake arguments in case
      // one of the arguments is -DCMAKE_BUILD_TYPE=...
      cm.AddCacheEntry("CMAKE_BUILD_TYPE", config, "Build configuration",
                       cmStateEnums::STRING);
    }
  }
  const char* recursionDepth =
    this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH");
  if (recursionDepth) {
    cm.AddCacheEntry("CMAKE_MAXIMUM_RECURSION_DEPTH", recursionDepth,
                     "Maximum recursion depth", cmStateEnums::STRING);
  }
  // if cmake args were provided then pass them in
  if (cmakeArgs) {
    // FIXME: Workaround to ignore unused CLI variables in try-compile.
    //
    // Ideally we should use SetArgs to honor options like --warn-unused-vars.
    // However, there is a subtle problem when certain arguments are passed to
    // a macro wrapping around try_compile or try_run that does not escape
    // semicolons in its parameters but just passes ${ARGV} or ${ARGN}.  In
    // this case a list argument like "-DVAR=a;b" gets split into multiple
    // cmake arguments "-DVAR=a" and "b".  Currently SetCacheArgs ignores
    // argument "b" and uses just "-DVAR=a", leading to a subtle bug in that
    // the try_compile or try_run does not get the proper value of VAR.  If we
    // call SetArgs here then it would treat "b" as the source directory and
    // cause an error such as "The source directory .../CMakeFiles/CMakeTmp/b
    // does not exist", thus breaking the try_compile or try_run completely.
    //
    // Strictly speaking the bug is in the wrapper macro because the CMake
    // language has always flattened nested lists and the macro should escape
    // the semicolons in its arguments before forwarding them.  However, this
    // bug is so subtle that projects typically work anyway, usually because
    // the value VAR=a is sufficient for the try_compile or try_run to get the
    // correct result.  Calling SetArgs here would break such projects that
    // previously built.  Instead we work around the issue by never reporting
    // unused arguments and ignoring options such as --warn-unused-vars.
    cm.SetWarnUnusedCli(false);
    // cm.SetArgs(*cmakeArgs, true);

    cm.SetCacheArgs(*cmakeArgs);
  }
  // to save time we pass the EnableLanguage info directly
  gg->EnableLanguagesFromGenerator(this->GetGlobalGenerator(), this);
  if (this->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "TRUE", "",
                     cmStateEnums::INTERNAL);
  } else {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "FALSE", "",
                     cmStateEnums::INTERNAL);
  }
  if (cm.Configure() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to configure test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  if (cm.Generate() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to generate test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // finally call the generator to actually build the resulting project
  int ret = this->GetGlobalGenerator()->TryCompile(
    jobs, srcdir, bindir, projectName, targetName, fast, output, this);

  this->IsSourceFileTryCompile = false;
  return ret;
}